

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stlma_(double *x,int *n,int *len,double *ave)

{
  int iVar1;
  int iVar2;
  int newn;
  double flen;
  double v;
  int local_38;
  int m;
  int k;
  int j;
  int i__;
  int i__1;
  double *ave_local;
  int *len_local;
  int *n_local;
  double *x_local;
  
  iVar2 = (*n - *len) + 1;
  iVar1 = *len;
  flen = 0.0;
  for (k = 1; k <= *len; k = k + 1) {
    flen = x[(long)k + -1] + flen;
  }
  *ave = flen / (double)iVar1;
  if (1 < iVar2) {
    local_38 = *len;
    v._4_4_ = 0;
    for (m = 2; m <= iVar2; m = m + 1) {
      local_38 = local_38 + 1;
      v._4_4_ = v._4_4_ + 1;
      flen = (flen - x[(long)v._4_4_ + -1]) + x[(long)local_38 + -1];
      ave[(long)m + -1] = flen / (double)iVar1;
    }
  }
  return 0;
}

Assistant:

int stlma_(double *x, int *n, int *len, double *ave)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int i__, j, k, m;
    double v, flen;
    int newn;

/* Moving Average (aka "running mean") */
/* ave(i) := mean(x{j}, j = max(1,i-k),..., min(n, i+k)) */
/*           for i = 1,2,..,n */
/* Arg */
/* Var */
    /* Parameter adjustments */
    --ave;
    --x;

    /* Function Body */
    newn = *n - *len + 1;
    flen = (double) (*len);
    v = 0.0;
    i__1 = *len;
    for (i__ = 1; i__ <= i__1; ++i__) {
	v += x[i__];
/* L3: */
    }
    ave[1] = v / flen;
    if (newn > 1) {
	k = *len;
	m = 0;
	i__1 = newn;
	for (j = 2; j <= i__1; ++j) {
	    ++k;
	    ++m;
	    v = v - x[m] + x[k];
	    ave[j] = v / flen;
/* L7: */
	}
    }
    return 0;
}